

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O0

bool tcmalloc::anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
               (unsigned_long *outptr,char *text,int base,int c,char **endptr)

{
  unsigned_long uVar1;
  char **endptr_local;
  int c_local;
  int base_local;
  char *text_local;
  unsigned_long *outptr_local;
  
  uVar1 = StringToIntegerUntilChar<unsigned_long>(*endptr,base,c,endptr);
  *outptr = uVar1;
  if ((*endptr == (char *)0x0) || (**endptr == '\0')) {
    outptr_local._7_1_ = false;
  }
  else {
    *endptr = *endptr + 1;
    outptr_local._7_1_ = true;
  }
  return outptr_local._7_1_;
}

Assistant:

bool StringToIntegerUntilCharWithCheck(
    T *outptr, char *text, int base, int c, char **endptr) {
  *outptr = StringToIntegerUntilChar<T>(*endptr, base, c, endptr);
  if (*endptr == nullptr || **endptr == '\0') return false;
  ++(*endptr);
  return true;
}